

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void deserialize_model<std::istream,int,unsigned_long>
               (ExtIsoForest *model,basic_istream<char,_std::char_traits<char>_> *in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian,bool lacks_range_penalty
               ,bool lacks_scoring_metric)

{
  ushort uVar1;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *pvVar2;
  pointer pIVar3;
  ScoringMetric SVar4;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *this;
  IsoHPlane *node;
  pointer node_00;
  ulong uVar5;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *__range2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer_;
  size_t veclen;
  size_t data_sizets [2];
  double data_doubles [2];
  
  if (!interrupt_switch) {
    if (lacks_range_penalty) {
      read_bytes<unsigned_char>(&buffer_,3,in);
      uVar1 = (ushort)buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      read_bytes<unsigned_char>(&buffer_,4,in);
      model->has_range_penalty =
           buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start._3_1_ != '\0';
      uVar1 = (ushort)buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    }
    uVar5 = (ulong)CONCAT14((char)(uVar1 >> 8),(uint)(uVar1 & 0xff));
    model->new_cat_action = (int)uVar5;
    model->cat_split_type = (int)(uVar5 >> 0x20);
    model->missing_action =
         (uint)buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start._2_1_;
    SVar4 = Depth;
    if (!lacks_scoring_metric) {
      read_bytes<unsigned_char>(&buffer_,1,in);
      SVar4 = (ScoringMetric)
              (byte)buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
    model->scoring_metric = SVar4;
    read_bytes<double,double>(data_doubles,2,in,buffer,diff_endian);
    model->exp_avg_depth = data_doubles[0];
    model->exp_avg_sep = data_doubles[1];
    read_bytes<unsigned_long,unsigned_long>(data_sizets,2,in,buffer,diff_endian);
    model->orig_sample_size = data_sizets[0];
    std::
    vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
    ::resize(&model->hplanes,data_sizets[1]);
    std::
    vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
    ::_M_shrink_to_fit(&model->hplanes);
    buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar2 = (model->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this = (model->hplanes).
                super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; this != pvVar2; this = this + 1) {
      read_bytes<unsigned_long,unsigned_long>(&veclen,1,in,buffer,diff_endian);
      std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::resize(this,veclen);
      std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::_M_shrink_to_fit(this);
      pIVar3 = (this->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (node_00 = (this->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                     super__Vector_impl_data._M_start; node_00 != pIVar3; node_00 = node_00 + 1) {
        deserialize_node<std::istream,int,unsigned_long>(node_00,in,&buffer_,buffer,diff_endian);
      }
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return;
}

Assistant:

void deserialize_model(ExtIsoForest &model, itype &in, std::vector<char> &buffer,
                       const bool diff_endian, const bool lacks_range_penalty,
                       const bool lacks_scoring_metric)
{
    if (interrupt_switch) return;

    if (lacks_range_penalty)
    {
        uint8_t data_en[3];
        read_bytes<uint8_t>((void*)data_en, (size_t)3, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
    }

    else
    {
        uint8_t data_en[4];
        read_bytes<uint8_t>((void*)data_en, (size_t)4, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
        model.has_range_penalty = (bool)data_en[3];
    }

    if (lacks_scoring_metric)
    {
        model.scoring_metric = Depth;
    }

    else
    {
        uint8_t data_en;
        read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
        model.scoring_metric = (ScoringMetric)data_en;
    }

    double data_doubles[2];
    read_bytes<double, double>((void*)data_doubles, (size_t)2, in, buffer, diff_endian);
    model.exp_avg_depth = data_doubles[0];
    model.exp_avg_sep = data_doubles[1];

    size_t data_sizets[2];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)2, in, buffer, diff_endian);
    model.orig_sample_size = data_sizets[0];
    model.hplanes.resize(data_sizets[1]);
    model.hplanes.shrink_to_fit();

    size_t veclen;
    std::vector<uint8_t> buffer_;
    for (auto &tree : model.hplanes) {
        read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer, diff_endian);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node<itype, saved_int_t, saved_size_t>(node, in, buffer_, buffer, diff_endian);
    }
}